

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

int CVodeInit(void *cvode_mem,CVRhsFn f,sunrealtype t0,N_Vector y0)

{
  N_Vector_Ops p_Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  SUNNonlinearSolver NLS;
  long lVar8;
  int error_code;
  char *msgfmt;
  undefined8 *puVar9;
  sunindextype liw1;
  sunindextype lrw1;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
    cvode_mem = (CVodeMem)0x0;
    iVar2 = 0x2b4;
  }
  else if (y0 == (N_Vector)0x0) {
    msgfmt = "y0 = NULL illegal.";
    error_code = -0x16;
    iVar2 = 0x2bf;
  }
  else if (f == (CVRhsFn)0x0) {
    msgfmt = "f = NULL illegal.";
    error_code = -0x16;
    iVar2 = 0x2c7;
  }
  else {
    p_Var1 = y0->ops;
    if ((((((p_Var1->nvclone == (_func_N_Vector_N_Vector *)0x0) ||
           (p_Var1->nvdestroy == (_func_void_N_Vector *)0x0)) ||
          (p_Var1->nvlinearsum ==
           (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0)) ||
         (((p_Var1->nvconst == (_func_void_sunrealtype_N_Vector *)0x0 ||
           (p_Var1->nvprod == (_func_void_N_Vector_N_Vector_N_Vector *)0x0)) ||
          ((p_Var1->nvdiv == (_func_void_N_Vector_N_Vector_N_Vector *)0x0 ||
           ((p_Var1->nvscale == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0 ||
            (p_Var1->nvabs == (_func_void_N_Vector_N_Vector *)0x0)))))))) ||
        (p_Var1->nvinv == (_func_void_N_Vector_N_Vector *)0x0)) ||
       (((p_Var1->nvaddconst == (_func_void_N_Vector_sunrealtype_N_Vector *)0x0 ||
         (p_Var1->nvmaxnorm == (_func_sunrealtype_N_Vector *)0x0)) ||
        (p_Var1->nvwrmsnorm == (_func_sunrealtype_N_Vector_N_Vector *)0x0)))) {
      msgfmt = "A required vector operation is not implemented.";
      error_code = -0x16;
      iVar2 = 0x2d2;
    }
    else {
      if (p_Var1->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
        lrw1 = 0;
        liw1 = 0;
      }
      else {
        N_VSpace(y0,&lrw1,&liw1);
      }
      *(sunindextype *)((long)cvode_mem + 0x6f8) = lrw1;
      *(sunindextype *)((long)cvode_mem + 0x700) = liw1;
      lVar3 = N_VClone(y0);
      *(long *)((long)cvode_mem + 0x1b8) = lVar3;
      if (lVar3 != 0) {
        lVar3 = N_VClone(y0);
        *(long *)((long)cvode_mem + 0x1c8) = lVar3;
        puVar9 = (undefined8 *)((long)cvode_mem + 0x1b8);
        if (lVar3 != 0) {
          lVar3 = N_VClone(y0);
          *(long *)((long)cvode_mem + 0x1d0) = lVar3;
          if (lVar3 != 0) {
            lVar3 = N_VClone(y0);
            *(long *)((long)cvode_mem + 0x1d8) = lVar3;
            if (lVar3 != 0) {
              lVar3 = N_VClone(y0);
              *(long *)((long)cvode_mem + 0x1e0) = lVar3;
              if (lVar3 != 0) {
                lVar3 = N_VClone(y0);
                *(long *)((long)cvode_mem + 0x1e8) = lVar3;
                if (lVar3 != 0) {
                  lVar3 = N_VClone(y0);
                  *(long *)((long)cvode_mem + 0x1f0) = lVar3;
                  if (lVar3 != 0) {
                    lVar3 = 0;
LAB_0011240d:
                    iVar2 = *(int *)((long)cvode_mem + 0x598);
                    if (lVar3 <= iVar2) {
                      lVar4 = N_VClone(y0);
                      *(long *)((long)cvode_mem + lVar3 * 8 + 0x150) = lVar4;
                      if (lVar4 != 0) goto code_r0x00112437;
                      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1b8));
                      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1c8));
                      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1d0));
                      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1d8));
                      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1e0));
                      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1e8));
                      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1f0));
                      for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
                        N_VDestroy(*(undefined8 *)((long)cvode_mem + lVar4 * 8 + 0x150));
                      }
                      goto LAB_00112488;
                    }
                    lVar3 = (long)iVar2 + 8;
                    *(long *)((long)cvode_mem + 0x718) =
                         *(long *)((long)cvode_mem + 0x718) +
                         *(long *)((long)cvode_mem + 0x6f8) * lVar3;
                    *(long *)((long)cvode_mem + 0x720) =
                         *(long *)((long)cvode_mem + 0x720) +
                         lVar3 * *(long *)((long)cvode_mem + 0x700);
                    *(int *)((long)cvode_mem + 0x830) = iVar2;
                    pvVar5 = malloc(0x68);
                    *(void **)((long)cvode_mem + 0xa50) = pvVar5;
                    pvVar6 = malloc(0x68);
                    *(void **)((long)cvode_mem + 0xa58) = pvVar6;
                    pvVar7 = malloc(0x68);
                    *(void **)((long)cvode_mem + 0xa60) = pvVar7;
                    if ((pvVar5 != (void *)0x0) && (pvVar6 != (void *)0x0 && pvVar7 != (void *)0x0))
                    {
                      *(CVRhsFn *)((long)cvode_mem + 0x10) = f;
                      *(sunrealtype *)((long)cvode_mem + 0x408) = t0;
                      N_VScale(0,y0,*(undefined8 *)((long)cvode_mem + 0x150));
                      NLS = SUNNonlinSol_Newton(y0,*cvode_mem);
                      if (NLS == (SUNNonlinearSolver)0x0) {
                        cvProcessError((CVodeMem)cvode_mem,-0x14,0x311,"CVodeInit",
                                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                                       ,"A memory request failed.");
                        cvFreeVectors((CVodeMem)cvode_mem);
                        return -0x14;
                      }
                      iVar2 = CVodeSetNonlinearSolver(cvode_mem,NLS);
                      if (iVar2 != 0) {
                        cvProcessError((CVodeMem)cvode_mem,iVar2,0x31e,"CVodeInit",
                                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                                       ,"Setting the nonlinear solver failed");
                        cvFreeVectors((CVodeMem)cvode_mem);
                        SUNNonlinSolFree(NLS);
                        return -0x14;
                      }
                      *(undefined4 *)((long)cvode_mem + 0x730) = 1;
                      *(undefined4 *)((long)cvode_mem + 0x3c0) = 1;
                      *(undefined8 *)((long)cvode_mem + 0x3cc) = 0x200000002;
                      *(undefined8 *)((long)cvode_mem + 0x5c8) =
                           *(undefined8 *)((long)cvode_mem + 0x5e0);
                      *(undefined8 *)((long)cvode_mem + 0x810) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x828) = 0x3ff0000000000000;
                      *(undefined8 *)((long)cvode_mem + 0x7f8) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x660) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x6a8) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x678) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x690) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x6c8) = 0;
                      *(undefined4 *)((long)cvode_mem + 0x6d8) = 0;
                      *(undefined4 *)((long)cvode_mem + 0x948) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x9c0) = 0;
                      *(undefined4 *)((long)cvode_mem + 0x9bc) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x3f0) = 0;
                      *(undefined4 *)((long)cvode_mem + 0x3c8) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x950) = 0;
                      lVar3 = (long)cvode_mem + 0x888;
                      *(undefined8 *)((long)cvode_mem + 0x628) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x630) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x7e0) = 0;
                      *(undefined8 *)((long)cvode_mem + 2000) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x7d8) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x7c0) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x7c8) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x800) = 0;
                      *(undefined8 *)((long)cvode_mem + 0x808) = 0;
                      for (lVar4 = 1; lVar4 != 6; lVar4 = lVar4 + 1) {
                        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
                          *(undefined8 *)(lVar3 + lVar8 * 8) = 0;
                        }
                        lVar3 = lVar3 + 0x20;
                      }
                      *(undefined4 *)((long)cvode_mem + 0x848) = 1;
                      return 0;
                    }
                    cvFreeVectors((CVodeMem)cvode_mem);
                    msgfmt = "A memory request failed.";
                    error_code = -0x14;
                    iVar2 = 0x2fc;
                    goto LAB_00112331;
                  }
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1e8));
                }
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1e0));
              }
              N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1d8));
            }
            N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1d0));
          }
          puVar9 = (undefined8 *)((long)cvode_mem + 0x1c8);
          N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1b8));
        }
        N_VDestroy(*puVar9);
      }
LAB_00112488:
      msgfmt = "A memory request failed.";
      error_code = -0x14;
      iVar2 = 0x2e8;
    }
  }
LAB_00112331:
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar2,"CVodeInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return error_code;
code_r0x00112437:
  lVar3 = lVar3 + 1;
  goto LAB_0011240d;
}

Assistant:

int CVodeInit(void* cvode_mem, CVRhsFn f, sunrealtype t0, N_Vector y0)
{
  CVodeMem cv_mem;
  sunbooleantype nvectorOK, allocOK;
  sunindextype lrw1, liw1;
  int i, k, retval;
  SUNNonlinearSolver NLS;

  /* Check cvode_mem */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Check for legal input parameters */

  if (y0 == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_Y0);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  if (f == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_F);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Test if all required vector operations are implemented */

  nvectorOK = cvCheckNvector(y0);
  if (!nvectorOK)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_NVECTOR);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Set space requirements for one N_Vector */

  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  else
  {
    lrw1 = 0;
    liw1 = 0;
  }
  cv_mem->cv_lrw1 = lrw1;
  cv_mem->cv_liw1 = liw1;

  /* Allocate the vectors (using y0 as a template) */

  allocOK = cvAllocVectors(cv_mem, y0);
  if (!allocOK)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* Allocate temporary work arrays for fused vector ops */
  cv_mem->cv_cvals = NULL;
  cv_mem->cv_cvals = (sunrealtype*)malloc(L_MAX * sizeof(sunrealtype));

  cv_mem->cv_Xvecs = NULL;
  cv_mem->cv_Xvecs = (N_Vector*)malloc(L_MAX * sizeof(N_Vector));

  cv_mem->cv_Zvecs = NULL;
  cv_mem->cv_Zvecs = (N_Vector*)malloc(L_MAX * sizeof(N_Vector));

  if ((cv_mem->cv_cvals == NULL) || (cv_mem->cv_Xvecs == NULL) ||
      (cv_mem->cv_Zvecs == NULL))
  {
    cvFreeVectors(cv_mem);
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* Input checks complete at this point and history array allocated */

  /* Copy the input parameters into CVODE state */
  cv_mem->cv_f  = f;
  cv_mem->cv_tn = t0;

  /* Initialize zn[0] in the history array */
  N_VScale(ONE, y0, cv_mem->cv_zn[0]);

  /* create a Newton nonlinear solver object by default */
  NLS = SUNNonlinSol_Newton(y0, cv_mem->cv_sunctx);

  /* check that nonlinear solver is non-NULL */
  if (NLS == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    cvFreeVectors(cv_mem);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* attach the nonlinear solver to the CVODE memory */
  retval = CVodeSetNonlinearSolver(cv_mem, NLS);

  /* check that the nonlinear solver was successfully attached */
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Setting the nonlinear solver failed");
    cvFreeVectors(cv_mem);
    SUNNonlinSolFree(NLS);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* set ownership flag */
  cv_mem->ownNLS = SUNTRUE;

  /* All error checking is complete at this point */

  /* Set step parameters */

  cv_mem->cv_q      = 1;
  cv_mem->cv_L      = 2;
  cv_mem->cv_qwait  = cv_mem->cv_L;
  cv_mem->cv_etamax = cv_mem->cv_eta_max_fs;

  cv_mem->cv_qu    = 0;
  cv_mem->cv_hu    = ZERO;
  cv_mem->cv_tolsf = ONE;

  /* Set the linear solver addresses to NULL.
     (We check != NULL later, in CVode) */

  cv_mem->cv_linit  = NULL;
  cv_mem->cv_lsetup = NULL;
  cv_mem->cv_lsolve = NULL;
  cv_mem->cv_lfree  = NULL;
  cv_mem->cv_lmem   = NULL;

  /* Set forceSetup to SUNFALSE */

  cv_mem->cv_forceSetup = SUNFALSE;

  /* Initialize all the counters */

  cv_mem->cv_nst     = 0;
  cv_mem->cv_nfe     = 0;
  cv_mem->cv_ncfn    = 0;
  cv_mem->cv_netf    = 0;
  cv_mem->cv_nni     = 0;
  cv_mem->cv_nnf     = 0;
  cv_mem->cv_nsetups = 0;
  cv_mem->cv_nhnil   = 0;
  cv_mem->cv_nstlp   = 0;
  cv_mem->cv_nscon   = 0;
  cv_mem->cv_nge     = 0;

  cv_mem->cv_irfnd = 0;

  /* Initialize other integrator optional outputs */

  cv_mem->cv_h0u    = ZERO;
  cv_mem->cv_next_h = ZERO;
  cv_mem->cv_next_q = 0;

  /* Initialize Stablilty Limit Detection data */
  /* NOTE: We do this even if stab lim det was not
     turned on yet. This way, the user can turn it
     on at any time */

  cv_mem->cv_nor = 0;
  for (i = 1; i <= 5; i++)
  {
    for (k = 1; k <= 3; k++) { cv_mem->cv_ssdat[i - 1][k - 1] = ZERO; }
  }

  /* Problem has been successfully initialized */

  cv_mem->cv_MallocDone = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}